

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall
CTcParser::insert_propset_expansion(CTcParser *this,propset_def *propset_stack,int propset_depth)

{
  CTcTokenSource *pCVar1;
  tc_toktyp_t tVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  undefined4 uVar8;
  CTcTokenizer *pCVar9;
  CTcTokenSource *pCVar10;
  CTcTokenSource *pCVar11;
  long lVar12;
  CTcTokenSource *pCVar13;
  propset_tok *ppVar14;
  ulong uVar15;
  CTcToken *pCVar16;
  ulong uVar17;
  
  if (propset_depth < 1) {
    return;
  }
  uVar17 = (ulong)(uint)propset_depth;
  lVar12 = 0;
  while (*(long *)((long)&propset_stack->param_tok_head + lVar12) == 0) {
    lVar12 = lVar12 + 0x18;
    if (uVar17 * 0x18 == lVar12) {
      return;
    }
  }
  pCVar10 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x48);
  pCVar10->_vptr_CTcTokenSource = (_func_int **)&PTR__CTcTokenSource_00356f50;
  pCVar1 = pCVar10 + 1;
  pCVar10[1]._vptr_CTcTokenSource = (_func_int **)0x0;
  pCVar10[1].enclosing_src_ = (CTcTokenSource *)0x0;
  pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
  *(undefined4 *)&pCVar11->_vptr_CTcTokenSource = 0x13;
  pCVar11->enclosing_src_ = (CTcTokenSource *)0x2c66d9;
  *(undefined8 *)&pCVar11->enclosing_curtok_ = 1;
  (pCVar11->enclosing_curtok_).int_val_ = 0;
  pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
  if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
    pCVar13 = pCVar1;
  }
  pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
  pCVar10[1].enclosing_src_ = pCVar11;
  uVar15 = 0;
  bVar7 = false;
  do {
    ppVar14 = propset_stack[uVar15].param_tok_head;
    if (ppVar14 != (propset_tok *)0x0) {
      bVar6 = !bVar7;
      do {
        if (!bVar6) {
          pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
          *(undefined4 *)&pCVar11->_vptr_CTcTokenSource = 0x15;
          pCVar11->enclosing_src_ = (CTcTokenSource *)0x2c7c48;
          *(undefined8 *)&pCVar11->enclosing_curtok_ = 1;
          (pCVar11->enclosing_curtok_).int_val_ = 0;
          pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
          if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
            pCVar13 = pCVar1;
          }
          pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
          pCVar10[1].enclosing_src_ = pCVar11;
        }
        tVar2 = (ppVar14->tok).typ_;
        bVar7 = false;
        if (tVar2 == TOKT_COMMA) {
          if ((ppVar14->nxt != (propset_tok *)0x0) && ((ppVar14->nxt->tok).typ_ == TOKT_TIMES)) {
            bVar7 = true;
            break;
          }
        }
        else if (tVar2 == TOKT_TIMES) break;
        pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
        pCVar13 = (CTcTokenSource *)(ppVar14->tok).text_;
        sVar3 = (ppVar14->tok).text_len_;
        pcVar4 = (char *)(ppVar14->tok).int_val_;
        pCVar11->_vptr_CTcTokenSource = *(_func_int ***)&ppVar14->tok;
        pCVar11->enclosing_src_ = pCVar13;
        *(size_t *)&pCVar11->enclosing_curtok_ = sVar3;
        (pCVar11->enclosing_curtok_).text_ = pcVar4;
        *(undefined1 *)&(pCVar11->enclosing_curtok_).text_len_ = (ppVar14->tok).field_0x20;
        (pCVar11->enclosing_curtok_).int_val_ = 0;
        pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
        if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
          pCVar13 = pCVar1;
        }
        pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
        pCVar10[1].enclosing_src_ = pCVar11;
        ppVar14 = ppVar14->nxt;
        bVar6 = true;
      } while (ppVar14 != (propset_tok *)0x0);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar17);
  if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
    bVar6 = bVar7;
    if (((G_tok->curtok_).typ_ != TOKT_RPAR) && (bVar6 = true, bVar7)) {
      pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
      *(undefined4 *)&pCVar11->_vptr_CTcTokenSource = 0x15;
      pCVar11->enclosing_src_ = (CTcTokenSource *)0x2c7c48;
      *(undefined8 *)&pCVar11->enclosing_curtok_ = 1;
      (pCVar11->enclosing_curtok_).int_val_ = 0;
      pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
      if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
        pCVar13 = pCVar1;
      }
      pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
      pCVar10[1].enclosing_src_ = pCVar11;
    }
    while (bVar7 = bVar6, pCVar9 = G_tok, tVar2 = (G_tok->curtok_).typ_, tVar2 != TOKT_EOF) {
      if (tVar2 == TOKT_RPAR) {
        CTcTokenizer::next(G_tok);
        break;
      }
      pCVar16 = &G_tok->curtok_;
      pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
      pCVar13 = (CTcTokenSource *)(pCVar9->curtok_).text_;
      sVar3 = (pCVar9->curtok_).text_len_;
      pcVar4 = (char *)(pCVar9->curtok_).int_val_;
      pCVar11->_vptr_CTcTokenSource = *(_func_int ***)pCVar16;
      pCVar11->enclosing_src_ = pCVar13;
      *(size_t *)&pCVar11->enclosing_curtok_ = sVar3;
      (pCVar11->enclosing_curtok_).text_ = pcVar4;
      *(undefined1 *)&(pCVar11->enclosing_curtok_).text_len_ = (pCVar9->curtok_).field_0x20;
      (pCVar11->enclosing_curtok_).int_val_ = 0;
      pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
      if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
        pCVar13 = pCVar1;
      }
      pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
      pCVar10[1].enclosing_src_ = pCVar11;
      CTcTokenizer::next(G_tok);
      bVar6 = bVar7;
    }
  }
  do {
    ppVar14 = propset_stack[uVar17 - 1].param_tok_head;
    do {
      if (ppVar14 == (propset_tok *)0x0) goto LAB_00234d5a;
      pCVar16 = &ppVar14->tok;
      ppVar14 = ppVar14->nxt;
    } while (pCVar16->typ_ != TOKT_TIMES);
    if ((ppVar14 != (propset_tok *)0x0) &&
       (((ppVar14->tok).typ_ != TOKT_COMMA ||
        (ppVar14 = ppVar14->nxt, ppVar14 != (propset_tok *)0x0)))) {
      bVar7 = !bVar7;
      do {
        if (!bVar7) {
          pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
          *(undefined4 *)&pCVar11->_vptr_CTcTokenSource = 0x15;
          pCVar11->enclosing_src_ = (CTcTokenSource *)0x2c7c48;
          *(undefined8 *)&pCVar11->enclosing_curtok_ = 1;
          (pCVar11->enclosing_curtok_).int_val_ = 0;
          pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
          if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
            pCVar13 = pCVar1;
          }
          pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
          pCVar10[1].enclosing_src_ = pCVar11;
        }
        pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
        pCVar13 = (CTcTokenSource *)(ppVar14->tok).text_;
        sVar3 = (ppVar14->tok).text_len_;
        pcVar4 = (char *)(ppVar14->tok).int_val_;
        pCVar11->_vptr_CTcTokenSource = *(_func_int ***)&ppVar14->tok;
        pCVar11->enclosing_src_ = pCVar13;
        *(size_t *)&pCVar11->enclosing_curtok_ = sVar3;
        (pCVar11->enclosing_curtok_).text_ = pcVar4;
        *(undefined1 *)&(pCVar11->enclosing_curtok_).text_len_ = (ppVar14->tok).field_0x20;
        (pCVar11->enclosing_curtok_).int_val_ = 0;
        pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
        if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
          pCVar13 = pCVar1;
        }
        pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
        pCVar10[1].enclosing_src_ = pCVar11;
        ppVar14 = ppVar14->nxt;
        bVar7 = true;
      } while (ppVar14 != (propset_tok *)0x0);
      bVar7 = false;
    }
LAB_00234d5a:
    uVar17 = uVar17 - 1;
    if (uVar17 == 0) {
      pCVar11 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x30);
      *(undefined4 *)&pCVar11->_vptr_CTcTokenSource = 0x14;
      pCVar11->enclosing_src_ = (CTcTokenSource *)0x2caac6;
      *(undefined8 *)&pCVar11->enclosing_curtok_ = 1;
      (pCVar11->enclosing_curtok_).int_val_ = 0;
      pCVar13 = (CTcTokenSource *)&((pCVar10[1].enclosing_src_)->enclosing_curtok_).int_val_;
      if (pCVar10[1].enclosing_src_ == (CTcTokenSource *)0x0) {
        pCVar13 = pCVar1;
      }
      pCVar13->_vptr_CTcTokenSource = (_func_int **)pCVar11;
      pCVar10[1].enclosing_src_ = pCVar11;
      pCVar9 = G_tok;
      pCVar10->enclosing_src_ = G_tok->ext_src_;
      uVar8 = *(undefined4 *)&(pCVar9->curtok_).field_0x4;
      pcVar4 = (pCVar9->curtok_).text_;
      sVar3 = (pCVar9->curtok_).text_len_;
      uVar5 = (pCVar9->curtok_).int_val_;
      (pCVar10->enclosing_curtok_).typ_ = (pCVar9->curtok_).typ_;
      *(undefined4 *)&(pCVar10->enclosing_curtok_).field_0x4 = uVar8;
      (pCVar10->enclosing_curtok_).text_ = pcVar4;
      (pCVar10->enclosing_curtok_).text_len_ = sVar3;
      (pCVar10->enclosing_curtok_).int_val_ = uVar5;
      (pCVar10->enclosing_curtok_).field_0x20 = (pCVar9->curtok_).field_0x20;
      pCVar9->ext_src_ = pCVar10;
      CTcTokenizer::next(pCVar9);
      return;
    }
  } while( true );
}

Assistant:

void CTcParser::insert_propset_expansion(struct propset_def *propset_stack,
                                         int propset_depth)
{
    /* 
     *   First, determine if we have any added formals from propertyset
     *   definitions.  
     */
    int i;
    int formals_found;
    for (formals_found = FALSE, i = 0 ; i < propset_depth ; ++i)
    {
        /* if this one has formals, so note */
        if (propset_stack[i].param_tok_head != 0)
        {
            /* note it, and we need not look further */
            formals_found = TRUE;
            break;
        }
    }
    
    /*
     *   If we found formals from property sets, we must expand them into the
     *   token stream.  
     */
    if (formals_found)
    {
        /* insert an open paren at the start of the expansion list */
		propset_token_source *tok_src = new (G_prsmem) propset_token_source;
        tok_src->insert_token(TOKT_LPAR, "(", 1);
        
        /* we don't yet need a leading comma */
        int need_comma = FALSE;
        
        /*
         *   Add the tokens from each propertyset in the stack, from the
         *   outside in, until we reach an asterisk in each stack.  
         */
        for (i = 0 ; i < propset_depth ; ++i)
        {
            propset_tok *cur;
            
            /* add the tokens from the stack element */
            for (cur = propset_stack[i].param_tok_head ; cur != 0 ;
                 cur = cur->nxt)
            {
                /*
                 *   If we need a comma before the next real element, add it
                 *   now.  
                 */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /*
                 *   If this is a comma and the next item is the '*', omit
                 *   the comma - if we have nothing more following, we want
                 *   to suppress the comma.  
                 */
                if (cur->tok.gettyp() == TOKT_COMMA
                    && cur->nxt != 0
                    && cur->nxt->tok.gettyp() == TOKT_TIMES)
                {
                    /* 
                     *   it's the comma before the star - simply stop here
                     *   for this list, but note that we need a comma before
                     *   any additional formals that we add in the future 
                     */
                    need_comma = TRUE;
                    break;
                }
                
                /* 
                 *   if it's the '*' for this list, stop here, since we want
                 *   to insert the next level in before we add these tokens 
                 */
                if (cur->tok.gettyp() == TOKT_TIMES)
                    break;
                
                /* insert it into our expansion list */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /*
         *   If we have explicit formals in the true input stream, add them,
         *   up to but not including the close paren.  
         */
        if (G_tok->cur() == TOKT_LPAR)
        {
            /* skip the open paren */
            G_tok->next();
            
            /* check for a non-empty list */
            if (G_tok->cur() != TOKT_RPAR)
            {
                /* 
                 *   the list is non-empty - if we need a comma, add it now 
                 */
                if (need_comma)
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                
                /* we will need a comma at the end of this list */
                need_comma = TRUE;
            }
            
            /* 
             *   copy everything up to but not including the close paren to
             *   the expansion list 
             */
            while (G_tok->cur() != TOKT_RPAR
                   && G_tok->cur() != TOKT_EOF)
            {
                /* insert this token into our expansion list */
                tok_src->insert_token(G_tok->getcur());
                
                /* skip it */
                G_tok->next();
            }
            
            /* skip the closing paren */
            if (G_tok->cur() == TOKT_RPAR)
                G_tok->next();
        }
        
        /* 
         *   Finish the expansion by adding the parts of each propertyset
         *   list after the '*' to the expansion list.  Copy from the inside
         *   out, since we want to unwind the nesting from outside in that we
         *   did to start with.  
         */
        for (i = propset_depth ; i != 0 ; )
        {
            /* move down to the next level */
            --i;
            
            /* find the '*' in this list */
            propset_tok *cur;
            for (cur = propset_stack[i].param_tok_head ;
                 cur != 0 && cur->tok.gettyp() != TOKT_TIMES ;
                 cur = cur->nxt) ;
            
            /* if we found the '*', skip it */
            if (cur != 0)
                cur = cur->nxt;
            
            /* 
             *   also skip the comma following the '*', if present - we'll
             *   explicitly insert the needed extra comma if we actually find
             *   we need one 
             */
            if (cur != 0 && cur->tok.gettyp() == TOKT_COMMA)
                cur = cur->nxt;
            
            /* insert the remainder of the list into the expansion list */
            for ( ; cur != 0 ; cur = cur->nxt)
            {
                /* if we need a comma, add it now */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /* insert this token */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /* add the closing paren at the end of the expansion list */
        tok_src->insert_token(TOKT_RPAR, ")", 1);
        
        /*
         *   We've fully expanded the formal list.  Now all that remains is
         *   to insert the expanded token list into the token input stream,
         *   so that we read from the expanded list instead of from the
         *   original token stream.  
         */
        G_tok->set_external_source(tok_src);
    }
}